

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::if2ip(string *__return_storage_ptr__,int address_family,string *ifn)

{
  short *psVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  string addr_candidate;
  ifaddrs *ifap;
  size_type __dnew;
  char buf [16];
  char *local_c0;
  size_type local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  long *local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long lStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  getifaddrs(&local_a0);
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = '\0';
  if (local_a0 != (long *)0x0) {
    local_78 = &__return_storage_ptr__->field_2;
    plVar6 = local_a0;
    do {
      if (((plVar6[3] != 0) && (iVar3 = std::__cxx11::string::compare((char *)ifn), iVar3 == 0)) &&
         ((address_family == 0 || ((uint)*(ushort *)plVar6[3] == address_family)))) {
        psVar1 = (short *)plVar6[3];
        if (*psVar1 == 10) {
          if ((*(uint *)(psVar1 + 4) & 0xc0ff) != 0x80fe) {
            uStack_48 = 0;
            uStack_42 = 0;
            lStack_58 = 0;
            uStack_50 = 0;
            local_4a = 0;
            local_68 = 0;
            lStack_60 = 0;
            pcVar4 = inet_ntop(10,psVar1 + 4,(char *)&local_68,0x2e);
            if (pcVar4 != (char *)0x0) {
              bVar2 = *(byte *)(psVar1 + 4) & 0xfe;
              if (bVar2 == 0xfc) {
                local_70 = 0x2e;
                local_98 = local_88;
                local_98 = (long *)std::__cxx11::string::_M_create
                                             ((ulong *)&local_98,(ulong)&local_70);
                local_88[0] = local_70;
                *(ulong *)((long)local_98 + 0x1e) = CONCAT62(uStack_48,local_4a);
                *(undefined8 *)((long)local_98 + 0x26) = uStack_42;
                local_98[2] = lStack_58;
                local_98[3] = CONCAT26(local_4a,uStack_50);
                *local_98 = local_68;
                local_98[1] = lStack_60;
                local_90 = local_70;
                *(undefined1 *)((long)local_98 + local_70) = 0;
                std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
                if (local_98 != local_88) {
                  operator_delete(local_98,local_88[0] + 1);
                }
              }
              else {
                freeifaddrs(local_a0);
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
                local_98 = (long *)0x2e;
                plVar5 = (long *)std::__cxx11::string::_M_create
                                           ((ulong *)__return_storage_ptr__,(ulong)&local_98);
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)plVar5;
                (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_98;
                *(ulong *)((long)plVar5 + 0x1e) = CONCAT62(uStack_48,local_4a);
                *(undefined8 *)((long)plVar5 + 0x26) = uStack_42;
                plVar5[2] = lStack_58;
                plVar5[3] = CONCAT26(local_4a,uStack_50);
                *plVar5 = local_68;
                plVar5[1] = lStack_60;
                __return_storage_ptr__->_M_string_length = (size_type)local_98;
                *(undefined1 *)((long)plVar5 + (long)local_98) = 0;
              }
              if (bVar2 != 0xfc) goto LAB_001b0d46;
            }
          }
        }
        else if ((*psVar1 == 2) &&
                (pcVar4 = inet_ntop(2,psVar1 + 2,(char *)&local_68,0x10), pcVar4 != (char *)0x0)) {
          freeifaddrs(local_a0);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
          local_98 = (long *)0x10;
          plVar6 = (long *)std::__cxx11::string::_M_create
                                     ((ulong *)__return_storage_ptr__,(ulong)&local_98);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_98;
          *plVar6 = local_68;
          plVar6[1] = lStack_60;
          __return_storage_ptr__->_M_string_length = (size_type)local_98;
          (__return_storage_ptr__->_M_dataplus)._M_p[(long)local_98] = '\0';
          goto LAB_001b0d46;
        }
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  freeifaddrs(local_a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_c0 == &local_b0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_af,local_b0);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_a8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_c0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_af,local_b0);
  }
  __return_storage_ptr__->_M_string_length = local_b8;
  local_b8 = 0;
  local_b0 = '\0';
  local_c0 = &local_b0;
LAB_001b0d46:
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(int address_family, const std::string &ifn) {
  struct ifaddrs *ifap;
  getifaddrs(&ifap);
  std::string addr_candidate;
  for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
    if (ifa->ifa_addr && ifn == ifa->ifa_name &&
        (AF_UNSPEC == address_family ||
         ifa->ifa_addr->sa_family == address_family)) {
      if (ifa->ifa_addr->sa_family == AF_INET) {
        auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
        char buf[INET_ADDRSTRLEN];
        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
          freeifaddrs(ifap);
          return std::string(buf, INET_ADDRSTRLEN);
        }
      } else if (ifa->ifa_addr->sa_family == AF_INET6) {
        auto sa = reinterpret_cast<struct sockaddr_in6 *>(ifa->ifa_addr);
        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
          char buf[INET6_ADDRSTRLEN] = {};
          if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
            // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
            auto s6_addr_head = sa->sin6_addr.s6_addr[0];
            if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
              addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
            } else {
              freeifaddrs(ifap);
              return std::string(buf, INET6_ADDRSTRLEN);
            }
          }
        }
      }
    }
  }
  freeifaddrs(ifap);
  return addr_candidate;
}